

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int cbb_buffer_reserve(cbb_buffer_st *base,uint8_t **out,size_t len)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  int line;
  ulong new_size;
  
  if (base == (cbb_buffer_st *)0x0) {
    return 0;
  }
  line = 0x4f;
  uVar3 = len + base->len;
  if (!CARRY8(len,base->len)) {
    uVar1 = base->cap;
    if (uVar3 <= uVar1) {
LAB_00175c4b:
      if (out == (uint8_t **)0x0) {
        return 1;
      }
      *out = base->buf + base->len;
      return 1;
    }
    line = 0x55;
    if ((base->field_0x18 & 1) != 0) {
      new_size = uVar1 * 2;
      if (uVar1 * 2 <= uVar3) {
        new_size = uVar3;
      }
      if ((long)uVar1 < 0) {
        new_size = uVar3;
      }
      puVar2 = (uint8_t *)OPENSSL_realloc(base->buf,new_size);
      if (puVar2 != (uint8_t *)0x0) {
        base->buf = puVar2;
        base->cap = new_size;
        goto LAB_00175c4b;
      }
      goto LAB_00175c02;
    }
  }
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                ,line);
LAB_00175c02:
  base->field_0x18 = base->field_0x18 | 2;
  return 0;
}

Assistant:

static int cbb_buffer_reserve(struct cbb_buffer_st *base, uint8_t **out,
                              size_t len) {
  if (base == NULL) {
    return 0;
  }

  size_t newlen = base->len + len;
  if (newlen < base->len) {
    // Overflow
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    goto err;
  }

  if (newlen > base->cap) {
    if (!base->can_resize) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      goto err;
    }

    size_t newcap = base->cap * 2;
    if (newcap < base->cap || newcap < newlen) {
      newcap = newlen;
    }
    uint8_t *newbuf =
        reinterpret_cast<uint8_t *>(OPENSSL_realloc(base->buf, newcap));
    if (newbuf == NULL) {
      goto err;
    }

    base->buf = newbuf;
    base->cap = newcap;
  }

  if (out) {
    *out = base->buf + base->len;
  }

  return 1;

err:
  base->error = 1;
  return 0;
}